

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putil.cpp
# Opt level: O0

UBool isValidOlsonID(char *id)

{
  int iVar1;
  bool bVar2;
  bool local_16;
  int local_14;
  int32_t idx;
  char *id_local;
  
  local_14 = 0;
  while( true ) {
    bVar2 = false;
    if ((id[local_14] != '\0') && ((id[local_14] < '0' || (bVar2 = false, '9' < id[local_14])))) {
      bVar2 = id[local_14] != ',';
    }
    if (!bVar2) break;
    local_14 = local_14 + 1;
  }
  local_16 = true;
  if (id[local_14] != '\0') {
    iVar1 = strcmp(id,"PST8PDT");
    local_16 = true;
    if (iVar1 != 0) {
      iVar1 = strcmp(id,"MST7MDT");
      local_16 = true;
      if (iVar1 != 0) {
        iVar1 = strcmp(id,"CST6CDT");
        local_16 = true;
        if (iVar1 != 0) {
          iVar1 = strcmp(id,"EST5EDT");
          local_16 = iVar1 == 0;
        }
      }
    }
  }
  return local_16;
}

Assistant:

static UBool isValidOlsonID(const char *id) {
    int32_t idx = 0;

    /* Determine if this is something like Iceland (Olson ID)
    or AST4ADT (non-Olson ID) */
    while (id[idx] && isNonDigit(id[idx]) && id[idx] != ',') {
        idx++;
    }

    /* If we went through the whole string, then it might be okay.
    The timezone is sometimes set to "CST-7CDT", "CST6CDT5,J129,J131/19:30",
    "GRNLNDST3GRNLNDDT" or similar, so we cannot use it.
    The rest of the time it could be an Olson ID. George */
    return (UBool)(id[idx] == 0
        || uprv_strcmp(id, "PST8PDT") == 0
        || uprv_strcmp(id, "MST7MDT") == 0
        || uprv_strcmp(id, "CST6CDT") == 0
        || uprv_strcmp(id, "EST5EDT") == 0);
}